

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

Item * __thiscall WorldShuffler::randomize_fortune_teller_hint(WorldShuffler *this)

{
  uchar *__src;
  pointer *ppuVar1;
  HintSource *pHVar2;
  RandomizerWorld *this_00;
  Item *item;
  uchar *puVar3;
  HintSource *this_01;
  mapped_type *ppIVar4;
  ostream *poVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __dest;
  char *__s;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hintable_items;
  string item_fancy_name;
  stringstream fortune_teller_hint;
  string local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [7];
  ios_base local_130 [264];
  
  if (this->_options->_archipelago_world != false) {
    return (Item *)0x0;
  }
  this_00 = this->_world;
  pHVar2 = (HintSource *)(local_1b0 + 0x10);
  local_1b0._0_8_ = pHVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Mercator fortune teller","");
  this_01 = RandomizerWorld::hint_source(this_00,(string *)local_1b0);
  if ((HintSource *)local_1b0._0_8_ != pHVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = this_01;
  std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
            ((vector<HintSource*,std::allocator<HintSource*>> *)&this->_world->_used_hint_sources,
             (HintSource **)local_1b0);
  HintSource::text_abi_cxx11_((string *)local_1b0,this_01);
  if ((HintSource *)local_1b0._0_8_ != pHVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  if (local_1b0._8_8_ != 0) {
    return (Item *)0x0;
  }
  local_1b0._0_4_ = 0x3839372b;
  __l._M_len = 4;
  __l._M_array = local_1b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_1e8,__l,(allocator_type *)&local_1d0);
  vectools::shuffle<unsigned_char>(&local_1e8,&this->_rng);
  local_1b0[0] = (string)*local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
  ppIVar4 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                  *)this->_world,local_1b0);
  item = *ppIVar4;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1b0[0] = (string)0x2b;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  ppIVar4 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                  *)this->_world,local_1b0);
  if (item == *ppIVar4) {
    __s = "an eye";
  }
  else {
    local_1b0[0] = (string)0x37;
    ppIVar4 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,local_1b0);
    if (item == *ppIVar4) {
      __s = "a nail";
    }
    else {
      local_1b0[0] = (string)0x39;
      ppIVar4 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                      *)this->_world,local_1b0);
      if (item == *ppIVar4) {
        __s = "a fang";
      }
      else {
        local_1b0[0] = (string)0x38;
        ppIVar4 = std::
                  map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                  ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                        *)this->_world,local_1b0);
        if (item != *ppIVar4) goto LAB_001996ac;
        __s = "a horn";
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_1d0,0,local_1d0._M_string_length,__s,6);
LAB_001996ac:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),"\x1cI see... \x1aI see... \x1a\nI see ",0x1c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b0 + 0x10),local_1d0._M_dataplus._M_p,
                      local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  random_hint_for_item_abi_cxx11_(&local_208,this,item);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                              (uint8_t)local_208._M_dataplus._M_p),
                      local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_208._M_dataplus._M_p._1_7_,(uint8_t)local_208._M_dataplus._M_p) !=
      &local_208.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_208._M_dataplus._M_p._1_7_,(uint8_t)local_208._M_dataplus._M_p),
                    local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this_01->_text,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_208._M_dataplus._M_p._1_7_,(uint8_t)local_208._M_dataplus._M_p) !=
      &local_208.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_208._M_dataplus._M_p._1_7_,(uint8_t)local_208._M_dataplus._M_p),
                    local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p._0_1_ = item->_id;
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                     ((this->_hintable_item_locations).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->_hintable_item_locations).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  puVar3 = (this->_hintable_item_locations).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest._M_current != puVar3) {
    __src = __dest._M_current + 1;
    if (__src != puVar3) {
      memmove(__dest._M_current,__src,(long)puVar3 - (long)__src);
    }
    ppuVar1 = &(this->_hintable_item_locations).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  if ((string *)
      local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return item;
  }
  return item;
}

Assistant:

Item* WorldShuffler::randomize_fortune_teller_hint()
{
    if(_options.archipelago_world())
        return nullptr;

    HintSource* fortune_teller_source = _world.hint_source("Mercator fortune teller");

    _world.add_used_hint_source(fortune_teller_source);

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!fortune_teller_source->text().empty())
        return nullptr;

    std::vector<uint8_t> hintable_items = { ITEM_GOLA_EYE, ITEM_GOLA_NAIL, ITEM_GOLA_FANG, ITEM_GOLA_HORN };
    vectools::shuffle(hintable_items, _rng);
    
    Item* hinted_item = _world.item(*(hintable_items.begin()));

    std::string item_fancy_name;
    if (hinted_item == _world.item(ITEM_GOLA_EYE))
        item_fancy_name = "an eye";
    else if (hinted_item == _world.item(ITEM_GOLA_NAIL))
        item_fancy_name = "a nail";
    else if (hinted_item == _world.item(ITEM_GOLA_FANG))
        item_fancy_name = "a fang";
    else if (hinted_item == _world.item(ITEM_GOLA_HORN))
        item_fancy_name = "a horn";

    std::stringstream fortune_teller_hint;
    fortune_teller_hint << "\x1cI see... \x1aI see... \x1a\nI see " << item_fancy_name << " " << this->random_hint_for_item(hinted_item) << ".";
    fortune_teller_source->text(fortune_teller_hint.str());

    vectools::erase_first(_hintable_item_locations, hinted_item->id());
    return hinted_item;
}